

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::isPostguardContaminated
          (StateQueryMemoryWriteGuard<long[4]> *this)

{
  ulong local_20;
  size_t i;
  StateQueryMemoryWriteGuard<long[4]> *this_local;
  
  local_20 = 0;
  while( true ) {
    if (0x1f < local_20) {
      return false;
    }
    if (*(char *)((long)this->m_postguard + local_20) != -0x22) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isPostguardContaminated (void) const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_postguard)[i] != (deUint8)WRITE_GUARD_VALUE)
			return true;
	return false;
}